

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O3

idx_t duckdb::SortKeyVarcharOperator::Decode
                (const_data_ptr_t input,Vector *result,idx_t result_idx,bool flip_bytes)

{
  uint *puVar1;
  anon_union_16_2_67f50693_for_value *paVar2;
  data_ptr_t pdVar3;
  data_t dVar4;
  ulong uVar5;
  long lVar6;
  undefined7 in_register_00000009;
  char *pcVar7;
  char cVar8;
  char *pcVar9;
  undefined1 *puVar10;
  Vector *vector;
  Vector *pVVar11;
  anon_struct_16_3_d7536bce_for_pointer aVar12;
  
  pdVar3 = result->data;
  dVar4 = 0xff;
  if ((int)CONCAT71(in_register_00000009,flip_bytes) == 0) {
    dVar4 = '\0';
  }
  pVVar11 = (Vector *)0x0;
  do {
    vector = pVVar11;
    pVVar11 = (Vector *)&vector->field_0x1;
  } while (dVar4 != input[(long)vector]);
  aVar12 = (anon_struct_16_3_d7536bce_for_pointer)
           StringVector::EmptyString((StringVector *)result,vector,result_idx);
  uVar5 = aVar12._0_8_;
  puVar1 = (uint *)(pdVar3 + result_idx * 0x10);
  paVar2 = (anon_union_16_2_67f50693_for_value *)(pdVar3 + result_idx * 0x10);
  pcVar9 = (paVar2->pointer).prefix;
  paVar2->pointer = aVar12;
  pcVar7 = aVar12.ptr;
  if (aVar12.length < 0xd) {
    pcVar7 = pcVar9;
  }
  puVar10 = &DAT_00000001;
  if (pVVar11 != (Vector *)&DAT_00000001) {
    lVar6 = 0;
    do {
      cVar8 = input[lVar6] + 0xff;
      if (flip_bytes) {
        cVar8 = -2 - input[lVar6];
      }
      pcVar7[lVar6] = cVar8;
      lVar6 = lVar6 + 1;
    } while (vector != (Vector *)lVar6);
    uVar5 = (ulong)*puVar1;
    puVar10 = (undefined1 *)pVVar11;
  }
  if ((uint)uVar5 < 0xd) {
    switchD_012e3010::default(pcVar9 + (uVar5 & 0xffffffff),0,0xc - (uVar5 & 0xffffffff));
  }
  else {
    puVar1[1] = **(uint **)(puVar1 + 2);
  }
  return (idx_t)puVar10;
}

Assistant:

static idx_t Decode(const_data_ptr_t input, Vector &result, idx_t result_idx, bool flip_bytes) {
		auto result_data = FlatVector::GetData<TYPE>(result);
		// iterate until we encounter the string delimiter to figure out the string length
		data_t string_delimiter = SortKeyVectorData::STRING_DELIMITER;
		if (flip_bytes) {
			string_delimiter = ~string_delimiter;
		}
		idx_t pos;
		for (pos = 0; input[pos] != string_delimiter; pos++) {
		}
		idx_t str_len = pos;
		// now allocate the string data and fill it with the decoded data
		result_data[result_idx] = StringVector::EmptyString(result, str_len);
		auto str_data = data_ptr_cast(result_data[result_idx].GetDataWriteable());
		for (pos = 0; pos < str_len; pos++) {
			if (flip_bytes) {
				str_data[pos] = (~input[pos]) - 1;
			} else {
				str_data[pos] = input[pos] - 1;
			}
		}
		result_data[result_idx].Finalize();
		return pos + 1;
	}